

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorTemplateBase<unsigned_char,_true>::push_back
          (SmallVectorTemplateBase<unsigned_char,_true> *this,uchar *Elt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  uchar *Elt_local;
  SmallVectorTemplateBase<unsigned_char,_true> *this_local;
  
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  sVar3 = SmallVectorBase::capacity((SmallVectorBase *)this);
  if (sVar3 <= sVar2) {
    grow(this,0);
  }
  pvVar1 = (this->super_SmallVectorTemplateCommon<unsigned_char,_void>).super_SmallVectorBase.BeginX
  ;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  *(uchar *)((long)pvVar1 + sVar2) = *Elt;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,sVar2 + 1);
  return;
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(this->end(), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }